

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerhand_test.cpp
# Opt level: O2

void __thiscall
TEST_PlayerHandTest_Kon_Test::~TEST_PlayerHandTest_Kon_Test(TEST_PlayerHandTest_Kon_Test *this)

{
  TEST_GROUP_CppUTestGroupPlayerHandTest::~TEST_GROUP_CppUTestGroupPlayerHandTest
            (&this->super_TEST_GROUP_CppUTestGroupPlayerHandTest);
  operator_delete(this,0x60);
  return;
}

Assistant:

TEST(PlayerHandTest, Kon)
{
	h.add(Tile::OneOfCircles);
	h.add(Tile::OneOfCircles);
	h.add(Tile::OneOfCircles);
	h.add(Tile::OneOfCircles);

	h.bindOpenQuad({
		Tile::OneOfCircles,
		Tile::OneOfCircles,
		Tile::OneOfCircles,
		Tile::OneOfCircles
	});

	CHECK(!h.isClosedHand());
}